

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O1

void __thiscall xray_re::xr_memory_writer::w_raw(xr_memory_writer *this,void *data,size_t size)

{
  size_type __new_size;
  
  if (size != 0) {
    __new_size = this->m_pos + size;
    if ((ulong)((long)(this->m_buffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) < __new_size) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_buffer,__new_size)
      ;
    }
    memmove((this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start + this->m_pos,data,size);
    this->m_pos = this->m_pos + size;
  }
  return;
}

Assistant:

void xr_memory_writer::w_raw(const void* data, size_t size)
{
	if (size) {
		if (m_pos + size > m_buffer.size())
			m_buffer.resize(m_pos + size);
		std::memmove(&m_buffer[m_pos], data, size);
		m_pos += size;
	}
}